

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

const_iterator __thiscall apngasm_cli::Options::inputFilesEnd_abi_cxx11_(Options *this)

{
  int iVar1;
  size_type sVar2;
  variable_value *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  byte local_7b;
  byte local_7a;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_51;
  key_type local_50;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_19;
  Options *local_18;
  Options *this_local;
  
  local_18 = this;
  if ((inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_), iVar1 != 0)
     ) {
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_19);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_,0,&local_19);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_19);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,&inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_);
  }
  std::allocator<char>::allocator();
  local_7a = 0;
  local_7b = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"files",&local_51);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)&this->field_0x28,&local_50);
  if (sVar2 == 0) {
    local_88._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&inputFilesEnd[abi:cxx11]()::empty_vector_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&this_local,&local_88);
  }
  else {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"files",&local_79);
    local_7b = 1;
    this_00 = boost::program_options::variables_map::operator[](&this->vm,&local_78);
    this_01 = boost::program_options::variable_value::
              as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(this_00);
    this_local = (Options *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(this_01);
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator(&local_79);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return (const_iterator)
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_local;
}

Assistant:

const std::vector<std::string>::const_iterator
Options::inputFilesEnd(void) const {
  static std::vector<std::string> empty_vector(0);
  return (vm.count("files") ? vm["files"].as<std::vector<std::string>>().end()
                            : empty_vector.end());
}